

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t cleanup_pathname(archive_write_disk *a)

{
  wchar_t wVar1;
  wchar_t local_2c;
  wchar_t rc;
  wchar_t error_number;
  archive_string error_string;
  archive_write_disk *a_local;
  
  _rc = (char *)0x0;
  error_string.s = (char *)0x0;
  error_string.length = 0;
  error_string.buffer_length = (size_t)a;
  wVar1 = cleanup_pathname_fsobj(a->name,&local_2c,(archive_string *)&rc,a->flags);
  if (wVar1 != L'\0') {
    archive_set_error((archive *)error_string.buffer_length,local_2c,"%s",_rc);
  }
  archive_string_free((archive_string *)&rc);
  return wVar1;
}

Assistant:

static int
cleanup_pathname(struct archive_write_disk *a)
{
	struct archive_string error_string;
	int error_number;
	int rc;
	archive_string_init(&error_string);
	rc = cleanup_pathname_fsobj(a->name, &error_number, &error_string,
	    a->flags);
	if (rc != ARCHIVE_OK) {
		archive_set_error(&a->archive, error_number, "%s",
		    error_string.s);
	}
	archive_string_free(&error_string);
	return rc;
}